

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::readDataSegments(WasmBinaryBuilder *this)

{
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var1;
  bool bVar2;
  uint32_t uVar3;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  Expression *pEVar4;
  size_t i;
  string_view sVar5;
  Name name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  Name local_88;
  string local_78;
  ulong local_58;
  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
  *local_50;
  WasmBinaryBuilder *local_48;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_40;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> curr;
  Index memIdx;
  
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"== readDataSegments\n");
  }
  uVar3 = getU32LEB(this);
  local_58 = (ulong)uVar3;
  local_50 = &this->memoryRefs;
  i = 0;
  local_48 = this;
  while( true ) {
    if (local_58 == i) {
      return;
    }
    Name::Name((Name *)local_98,"");
    Name::Name(&local_88,"");
    name.super_IString.str._M_str = (char *)local_98._0_8_;
    name.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeDataSegment
              (name,(Name)stack0xffffffffffffff70,SUB81(local_88.super_IString.str._M_str,0),
               (Expression *)0x0,(char *)0x0,(Address)0xc12c44);
    uVar3 = getU32LEB(this);
    _Var1._M_head_impl = local_40._M_head_impl;
    if (2 < uVar3) break;
    sVar5 = (string_view)Name::fromInt(i);
    this = local_48;
    ((_Var1._M_head_impl)->super_Named).name.super_IString.str = sVar5;
    ((_Var1._M_head_impl)->super_Named).hasExplicitName = false;
    (local_40._M_head_impl)->isPassive = (bool)((byte)uVar3 & 1);
    if ((uVar3 & 1) == 0) {
      curr._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
      super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl._4_4_ = 0;
      if (uVar3 == 2) {
        curr._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl._4_4_ = getU32LEB(local_48);
      }
      this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
                std::
                map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
                ::operator[](local_50,(key_type *)
                                      ((long)&curr._M_t.
                                              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                              .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                              _M_head_impl + 4));
      local_78._M_dataplus._M_p = (pointer)&(local_40._M_head_impl)->memory;
      std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
                (this_00,(Name **)&local_78);
      pEVar4 = readExpression(this);
      (local_40._M_head_impl)->offset = pEVar4;
    }
    else {
      ((local_40._M_head_impl)->memory).super_IString.str._M_len = 0;
      ((local_40._M_head_impl)->memory).super_IString.str._M_str = (char *)0x0;
      (local_40._M_head_impl)->offset = (Expression *)0x0;
    }
    uVar3 = getU32LEB(this);
    sVar5 = getByteView(this,(ulong)uVar3);
    std::vector<char,std::allocator<char>>::vector<char_const*,void>
              ((vector<char,std::allocator<char>> *)&local_78,sVar5._M_str,
               sVar5._M_str + sVar5._M_len,
               (allocator_type *)
               ((long)&curr._M_t.
                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 4));
    std::vector<char,_std::allocator<char>_>::_M_move_assign
              (&(local_40._M_head_impl)->data,&local_78);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&local_78);
    Module::addDataSegment
              (this->wasm,
               (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_40);
    std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
              ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_40);
    i = i + 1;
  }
  std::__cxx11::to_string(&local_78,uVar3);
  std::operator+(&local_b8,"bad segment flags, must be 0, 1, or 2, not ",&local_78);
  throwError(local_48,&local_b8);
}

Assistant:

void WasmBinaryBuilder::readDataSegments() {
  BYN_TRACE("== readDataSegments\n");
  auto num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto curr = Builder::makeDataSegment();
    uint32_t flags = getU32LEB();
    if (flags > 2) {
      throwError("bad segment flags, must be 0, 1, or 2, not " +
                 std::to_string(flags));
    }
    curr->setName(Name::fromInt(i), false);
    curr->isPassive = flags & BinaryConsts::IsPassive;
    if (curr->isPassive) {
      curr->memory = Name();
      curr->offset = nullptr;
    } else {
      Index memIdx = 0;
      if (flags & BinaryConsts::HasIndex) {
        memIdx = getU32LEB();
      }
      memoryRefs[memIdx].push_back(&curr->memory);
      curr->offset = readExpression();
    }
    auto size = getU32LEB();
    auto data = getByteView(size);
    curr->data = {data.begin(), data.end()};
    wasm.addDataSegment(std::move(curr));
  }
}